

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_InternalKey_EncodeDecode::_Run(_Test_InternalKey_EncodeDecode *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *__end;
  long lVar3;
  allocator local_59;
  long local_58;
  string local_50;
  
  paVar1 = &local_50.field_2;
  local_58 = 0;
  do {
    iVar2 = (&DAT_0010b330)[local_58];
    lVar3 = 0;
    do {
      std::__cxx11::string::string
                ((string *)&local_50,(char *)((long)&DAT_0010b330 + (long)iVar2),&local_59);
      TestKey(&local_50,*(uint64_t *)((long)&DAT_0010b340 + lVar3),kTypeValue);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"hello","");
      TestKey(&local_50,1,kTypeDeletion);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x60);
    local_58 = local_58 + 1;
  } while (local_58 != 4);
  return;
}

Assistant:

TEST(FormatTest, InternalKey_EncodeDecode) {
  const char* keys[] = {"", "k", "hello", "longggggggggggggggggggggg"};
  const uint64_t seq[] = {1,
                          2,
                          3,
                          (1ull << 8) - 1,
                          1ull << 8,
                          (1ull << 8) + 1,
                          (1ull << 16) - 1,
                          1ull << 16,
                          (1ull << 16) + 1,
                          (1ull << 32) - 1,
                          1ull << 32,
                          (1ull << 32) + 1};
  for (int k = 0; k < sizeof(keys) / sizeof(keys[0]); k++) {
    for (int s = 0; s < sizeof(seq) / sizeof(seq[0]); s++) {
      TestKey(keys[k], seq[s], kTypeValue);
      TestKey("hello", 1, kTypeDeletion);
    }
  }
}